

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O3

void __thiscall
duckdb::CopyDatabaseStatement::CopyDatabaseStatement
          (CopyDatabaseStatement *this,string *from_database_p,string *to_database_p,
          CopyDatabaseType copy_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_SQLStatement).type = COPY_DATABASE_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CopyDatabaseStatement_02450ee8
  ;
  paVar2 = &(this->from_database).field_2;
  (this->from_database)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (from_database_p->_M_dataplus)._M_p;
  paVar1 = &from_database_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&from_database_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->from_database).field_2 + 8) = uVar4;
  }
  else {
    (this->from_database)._M_dataplus._M_p = pcVar3;
    (this->from_database).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->from_database)._M_string_length = from_database_p->_M_string_length;
  (from_database_p->_M_dataplus)._M_p = (pointer)paVar1;
  from_database_p->_M_string_length = 0;
  (from_database_p->field_2)._M_local_buf[0] = '\0';
  paVar2 = &(this->to_database).field_2;
  (this->to_database)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (to_database_p->_M_dataplus)._M_p;
  paVar1 = &to_database_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&to_database_p->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->to_database).field_2 + 8) = uVar4;
  }
  else {
    (this->to_database)._M_dataplus._M_p = pcVar3;
    (this->to_database).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->to_database)._M_string_length = to_database_p->_M_string_length;
  (to_database_p->_M_dataplus)._M_p = (pointer)paVar1;
  to_database_p->_M_string_length = 0;
  (to_database_p->field_2)._M_local_buf[0] = '\0';
  this->copy_type = copy_type;
  return;
}

Assistant:

explicit SQLStatement(StatementType type) : type(type) {
	}